

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodDescriptorProto::InternalSwap
          (MethodDescriptorProto *this,MethodDescriptorProto *other)

{
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  MethodDescriptorProto *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **__a;
  long in_RSI;
  long in_RDI;
  UnknownFieldSet *in_stack_fffffffffffffeb8;
  InternalMetadataWithArena *in_stack_fffffffffffffec0;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *in_stack_fffffffffffffef0;
  
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)(in_RSI + 8);
  if (((uint)*(undefined8 *)(in_RDI + 8) & 1) != 1) {
    if (((uint)*(undefined8 *)this_00 & 1) != 1) goto LAB_00506618;
  }
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
    ::
    PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
              (this_00);
  }
  else {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    ::mutable_unknown_fields_slow(in_stack_fffffffffffffef0);
  }
  internal::InternalMetadataWithArena::DoSwap(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
LAB_00506618:
  std::swap<unsigned_int>((uint *)(in_RDI + 0x10),(uint *)(in_RSI + 0x10));
  this_01 = (MethodDescriptorProto *)(in_RDI + 0x18);
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(this_01);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RSI + 0x18));
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(this_01);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RSI + 0x20));
  __a = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 0x28);
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(this_01);
  std::swap<std::__cxx11::string*>
            (__a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                 (in_RSI + 0x28));
  std::swap<google::protobuf::MethodOptions*>
            ((MethodOptions **)(in_RDI + 0x30),(MethodOptions **)(in_RSI + 0x30));
  std::swap<bool>((bool *)(in_RDI + 0x38),(bool *)(in_RSI + 0x38));
  std::swap<bool>((bool *)(in_RDI + 0x39),(bool *)(in_RSI + 0x39));
  return;
}

Assistant:

void MethodDescriptorProto::InternalSwap(MethodDescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  input_type_.Swap(&other->input_type_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  output_type_.Swap(&other->output_type_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(options_, other->options_);
  swap(client_streaming_, other->client_streaming_);
  swap(server_streaming_, other->server_streaming_);
}